

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::pprint::Indent_abi_cxx11_(string *__return_storage_ptr__,pprint *this,uint32_t n)

{
  int iVar1;
  ulong uVar2;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  uVar2 = (ulong)this & 0xffffffff;
  ::std::__cxx11::stringstream::stringstream(asStack_1a8);
  while (iVar1 = (int)uVar2, uVar2 = (ulong)(iVar1 - 1), iVar1 != 0) {
    ::std::operator<<(local_198,(string *)sIndentString_abi_cxx11_);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Indent(uint32_t n) {
  std::stringstream ss;

  for (uint32_t i = 0; i < n; i++) {
    ss << sIndentString;
  }

  return ss.str();
}